

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVector.cpp
# Opt level: O0

string * __thiscall AlphaVector::SoftPrint_abi_cxx11_(AlphaVector *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pdVar3;
  uint *in_RSI;
  string *in_RDI;
  const_iterator it;
  stringstream ss;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_1b0 [3];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,"a ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*in_RSI);
  poVar2 = std::operator<<(poVar2," bI ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(longlong *)(in_RSI + 2));
  std::operator<<(poVar2," : values");
  local_1b0[0]._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
  while( true ) {
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffdf8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar1) break;
    in_stack_fffffffffffffe00 = std::operator<<(local_188," ");
    pdVar3 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_1b0);
    std::ostream::operator<<(in_stack_fffffffffffffe00,*pdVar3);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               poVar2,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string AlphaVector::SoftPrint() const
{
    stringstream ss;
    ss << "a " << _m_action << " bI " << _m_betaI
       << " : values";
    vector<double>::const_iterator it=_m_values.begin();
    while(it!=_m_values.end())
    {
        ss << " " << *it;
        it++;
    }
    return(ss.str());
}